

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison.h
# Opt level: O2

bool Compare<std::__cxx11::string_const&>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs,Comparison cmp
               )

{
  __type _Var1;
  bool bVar2;
  
  switch(cmp) {
  case Less:
    bVar2 = std::operator<(lhs,rhs);
    return bVar2;
  case LessOrEqual:
    bVar2 = std::operator<=(lhs,rhs);
    return bVar2;
  case Greater:
    bVar2 = std::operator>(lhs,rhs);
    return bVar2;
  case GreaterOrEqual:
    bVar2 = std::operator>=(lhs,rhs);
    return bVar2;
  case Equal:
    _Var1 = std::operator==(lhs,rhs);
    return _Var1;
  case NotEqual:
    bVar2 = std::operator!=(lhs,rhs);
    return bVar2;
  default:
    return true;
  }
}

Assistant:

bool Compare(ValueType lhs, ValueType rhs, Comparison cmp) {
    switch (cmp) {
    case Comparison::Less:
        return lhs < rhs;
    case Comparison::LessOrEqual:
        return lhs <= rhs;
    case Comparison::Greater:
        return lhs > rhs;
    case Comparison::GreaterOrEqual:
        return lhs >= rhs;
    case Comparison::Equal:
        return lhs == rhs;
    case Comparison::NotEqual:
        return lhs != rhs;
    default:
        return true;
    }
}